

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

int64_t Imf_3_4::ostream_write
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  undefined8 uVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  int64_t nwrite;
  lock_guard<std::mutex> lk;
  ostream_holder *oh;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  long local_8;
  
  if (0x7fffffff < in_RCX) {
    (*in_R9)(in_RDI,10,"Stream interface request to write block too large");
    return -1;
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (in_R8 != *(long *)(in_RSI + 0x28)) {
    (**(code **)(**(long **)(in_RSI + 0x30) + 0x20))(*(long **)(in_RSI + 0x30),in_R8);
    uVar1 = (**(code **)(**(long **)(in_RSI + 0x30) + 0x18))();
    *(undefined8 *)(in_RSI + 0x28) = uVar1;
    if (in_R8 != *(long *)(in_RSI + 0x28)) {
      (*in_R9)(in_RDI,10,"Unable to seek to desired offset %lu",in_R8);
      local_8 = -1;
      goto LAB_0019a12d;
    }
  }
  local_8 = *(long *)(in_RSI + 0x28);
  (**(code **)(**(long **)(in_RSI + 0x30) + 0x10))
            (*(long **)(in_RSI + 0x30),in_RDX,in_RCX & 0xffffffff);
  uVar1 = (**(code **)(**(long **)(in_RSI + 0x30) + 0x18))();
  *(undefined8 *)(in_RSI + 0x28) = uVar1;
  local_8 = *(long *)(in_RSI + 0x28) - local_8;
LAB_0019a12d:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19a137);
  return local_8;
}

Assistant:

static int64_t
ostream_write (
    exr_const_context_t         ctxt,
    void*                       userdata,
    const void*                 buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    ostream_holder* oh = static_cast<ostream_holder*> (userdata);

    if (sz > INT_MAX)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Stream interface request to write block too large");
        return -1;
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lk{oh->_mx};
#endif

    if (offset != oh->_cur_offset)
    {
        oh->_stream->seekp (offset);
        oh->_cur_offset = oh->_stream->tellp ();
        if (offset != oh->_cur_offset)
        {
            error_cb (
                ctxt,
                EXR_ERR_READ_IO,
                "Unable to seek to desired offset %" PRIu64,
                offset);
            return -1;
        }
    }

    int64_t nwrite = oh->_cur_offset;
    try
    {
        oh->_stream->write (
            static_cast<const char*> (buffer), static_cast<int> (sz));
        oh->_cur_offset = oh->_stream->tellp ();
        nwrite          = oh->_cur_offset - nwrite;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64,
            offset);
        nwrite = -1;
    }
    return nwrite;
}